

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_4::anon_unknown_0::checkCoreFile(exr_context_t f,bool reduceMemory,bool reduceTime)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer puVar8;
  int c;
  long lVar9;
  long lVar10;
  undefined7 in_register_00000031;
  size_type sVar11;
  long lVar12;
  byte bVar13;
  int32_t xlevel;
  long lVar14;
  int64_t curx;
  int32_t ylevel;
  int iVar15;
  long lVar16;
  uint64_t chunk;
  long lVar17;
  ulong uVar18;
  int32_t curtw;
  int32_t lines_per_chunk;
  int32_t curth;
  exr_tile_level_mode_t levelmode;
  uint local_2c0;
  int local_2bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  exr_storage_t store;
  int numparts;
  int32_t levh;
  int32_t levw;
  int32_t levelsy;
  int32_t levelsx;
  exr_attr_box2i_t datawin;
  long local_278;
  exr_tile_round_mode_t roundingmode;
  uint32_t tysz;
  exr_chunk_info_t cinfo;
  undefined8 local_228;
  long local_220;
  short local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1b8;
  code *local_130;
  
  iVar3 = exr_get_count(f,&numparts);
  if (iVar3 == 0) {
    local_2c0 = (uint)CONCAT71(in_register_00000031,reduceMemory) ^ 1;
    for (iVar3 = 0; iVar3 < numparts; iVar3 = iVar3 + 1) {
      iVar4 = exr_get_storage(f,iVar3,&store);
      if (iVar4 != 0) goto LAB_0011151a;
      if ((store & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_TILED) {
        iVar4 = exr_get_data_window(f,iVar3,&datawin);
        if (((iVar4 != 0) ||
            (iVar4 = exr_get_tile_descriptor
                               (f,iVar3,&lines_per_chunk,&tysz,&levelmode,&roundingmode), iVar4 != 0
            )) || (iVar4 = exr_get_tile_levels(f,iVar3,&levelsx,&levelsy), iVar4 != 0))
        goto LAB_0011151a;
        bVar2 = true;
        iVar4 = 0;
        for (iVar15 = 0; (bVar2 && (iVar15 < levelsy)); iVar15 = iVar15 + 1) {
          iVar5 = 0;
LAB_00111887:
          if ((!bVar2) || (levelsx <= iVar5)) goto LAB_00111be7;
          iVar6 = exr_get_level_sizes(f,iVar3,iVar5,iVar15,&levw,&levh);
          if ((iVar6 == 0) &&
             (iVar6 = exr_get_tile_sizes(f,iVar3,iVar5,iVar15,&curtw,&curth), iVar6 == 0)) {
            imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            bVar13 = 0;
            memset(&local_220,0,0x1f0);
            local_228 = 0x1f8;
            local_2bc = 0;
            for (local_278 = 0; (bVar2 && (local_278 < levh)); local_278 = local_278 + curth) {
              iVar6 = 0;
              for (lVar10 = 0; lVar10 < levw; lVar10 = lVar10 + curtw) {
                iVar7 = exr_read_tile_chunk_info(f,iVar3,iVar6,local_2bc,iVar5,iVar15,&cinfo);
                if (iVar7 == 0) {
                  if (local_220 == 0) {
                    iVar7 = exr_decoding_initialize(f,iVar3,&cinfo);
                    if (iVar7 == 0) {
                      lVar14 = 0x28;
                      sVar11 = 0;
                      for (lVar16 = 0; lVar16 < local_218; lVar16 = lVar16 + 1) {
                        *(size_type *)(local_220 + lVar14) = sVar11 + 0x1000;
                        sVar1 = *(short *)(local_220 + -0xc + lVar14);
                        *(int *)(local_220 + -8 + lVar14) = (int)sVar1;
                        *(int32_t *)(local_220 + -4 + lVar14) = curtw * sVar1;
                        sVar11 = sVar11 + (long)curth * (long)curtw * (long)sVar1;
                        lVar14 = lVar14 + 0x30;
                      }
                      bVar13 = sVar11 < 1000000 | (byte)local_2c0;
                      if (cinfo.type == '\x03') {
                        local_1b8 = &imgdata;
                        local_130 = realloc_deepdata;
                      }
                      else if (bVar13 != 0) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&imgdata,sVar11);
                      }
                      iVar7 = exr_decoding_choose_default_routines(f,iVar3,&local_228);
                      if (iVar7 == 0) goto LAB_00111af1;
                    }
LAB_00111b99:
                    bVar2 = false;
                    iVar4 = iVar7;
                    break;
                  }
                  iVar7 = exr_decoding_update(f,iVar3,&cinfo,&local_228);
                  if (iVar7 == 0) {
LAB_00111af1:
                    if ((bVar13 & 1) == 0) {
                      bVar13 = 0;
                    }
                    else {
                      if (cinfo.type != '\x03') {
                        lVar14 = 0x28;
                        puVar8 = imgdata.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                        for (lVar16 = 0; lVar16 < local_218; lVar16 = lVar16 + 1) {
                          *(pointer *)(local_220 + lVar14) = puVar8;
                          sVar1 = *(short *)(local_220 + -0xc + lVar14);
                          *(int *)(local_220 + -8 + lVar14) = (int)sVar1;
                          *(int32_t *)(local_220 + -4 + lVar14) = curtw * sVar1;
                          puVar8 = puVar8 + (long)curth * (long)curtw * (long)sVar1;
                          lVar14 = lVar14 + 0x30;
                        }
                      }
                      iVar7 = exr_decoding_run(f,iVar3,&local_228);
                      if (iVar7 != 0) {
                        iVar4 = iVar7;
                      }
                      bVar13 = 1;
                      if (reduceTime && iVar7 != 0) goto LAB_00111b99;
                    }
                  }
                  else {
                    iVar4 = iVar7;
                    if (reduceTime) goto LAB_00111b99;
                  }
                }
                else {
                  if (iVar5 == iVar15) {
                    iVar4 = iVar7;
                  }
                  if (levelmode == EXR_TILE_RIPMAP_LEVELS) {
                    iVar4 = iVar7;
                  }
                  if (reduceTime) {
                    bVar2 = false;
                    break;
                  }
                }
                iVar6 = iVar6 + 1;
              }
              local_2bc = local_2bc + 1;
            }
            exr_decoding_destroy(f,&local_228);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_001118fb:
            iVar5 = iVar5 + 1;
            goto LAB_00111887;
          }
          if (iVar5 == iVar15) {
            iVar4 = iVar6;
          }
          if (levelmode == EXR_TILE_RIPMAP_LEVELS) {
            iVar4 = iVar6;
          }
          if (!reduceTime) goto LAB_001118fb;
          bVar2 = false;
LAB_00111be7:
        }
LAB_00111c1a:
        if (iVar4 != 0) goto LAB_0011151a;
      }
      else if ((store & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_SCANLINE) {
        iVar4 = exr_get_data_window(f,iVar3,&datawin);
        if (iVar4 == 0) {
          lVar10 = (long)datawin.max.x;
          lVar14 = (long)datawin.min.x;
          lVar16 = (long)datawin.max.y;
          lVar17 = (long)datawin.min.y;
          imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          memset(&local_220,0,0x1f0);
          local_228 = 0x1f8;
          iVar4 = exr_get_scanlines_per_chunk(f,iVar3,&lines_per_chunk);
          if (iVar4 == 0) {
            lVar10 = (lVar10 - lVar14) + 1;
            bVar13 = 0;
            iVar15 = 0;
            for (uVar18 = 0; iVar4 = iVar15, uVar18 < (lVar16 - lVar17) + 1U;
                uVar18 = uVar18 + (long)lines_per_chunk) {
              cinfo.sample_count_data_offset = 0;
              cinfo.sample_count_table_size = 0;
              cinfo.packed_size = 0;
              cinfo.unpacked_size = 0;
              cinfo.width = 0;
              cinfo.level_x = '\0';
              cinfo.level_y = '\0';
              cinfo.type = '\0';
              cinfo.compression = '\0';
              cinfo.data_offset = 0;
              cinfo.idx = 0;
              cinfo.start_x = 0;
              cinfo.start_y = 0;
              cinfo.height = 0;
              iVar5 = exr_read_scanline_chunk_info(f,iVar3,datawin.min.y + (int)uVar18,&cinfo);
              if (iVar5 == 0) {
                if (local_220 == 0) {
                  iVar5 = exr_decoding_initialize(f,iVar3,&cinfo);
                  if (iVar5 != 0) break;
                  lVar14 = 0x28;
                  sVar11 = 0;
                  for (lVar9 = 0; lVar9 < local_218; lVar9 = lVar9 + 1) {
                    *(undefined8 *)(local_220 + lVar14) = 0x1000;
                    sVar1 = *(short *)(local_220 + -0xc + lVar14);
                    *(int *)(local_220 + -8 + lVar14) = (int)sVar1;
                    lVar12 = sVar1 * lVar10;
                    *(int *)(local_220 + -4 + lVar14) = (int)lVar12;
                    sVar11 = sVar11 + lines_per_chunk * lVar12;
                    lVar14 = lVar14 + 0x30;
                  }
                  bVar13 = sVar11 < 8000000 | (byte)local_2c0;
                  if (cinfo.type == '\x02') {
                    local_1b8 = &imgdata;
                    local_130 = realloc_deepdata;
                  }
                  else if (bVar13 != 0) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&imgdata,sVar11);
                  }
                  iVar4 = exr_decoding_choose_default_routines(f,iVar3,&local_228);
                  if (iVar4 != 0) {
                    iVar4 = 1;
                    break;
                  }
                }
                else {
                  iVar5 = exr_decoding_update(f,iVar3,&cinfo,&local_228);
                  if (iVar5 != 0) goto LAB_00111649;
                }
                if ((bVar13 & 1) == 0) {
                  bVar13 = 0;
                }
                else {
                  if (cinfo.type != '\x02') {
                    lVar14 = 0x28;
                    puVar8 = imgdata.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    for (lVar9 = 0; lVar9 < local_218; lVar9 = lVar9 + 1) {
                      *(pointer *)(local_220 + lVar14) = puVar8;
                      sVar1 = *(short *)(local_220 + -0xc + lVar14);
                      *(int *)(local_220 + -8 + lVar14) = (int)sVar1;
                      lVar12 = sVar1 * lVar10;
                      *(int *)(local_220 + -4 + lVar14) = (int)lVar12;
                      puVar8 = puVar8 + lines_per_chunk * lVar12;
                      lVar14 = lVar14 + 0x30;
                    }
                  }
                  iVar4 = exr_decoding_run(f,iVar3,&local_228);
                  if (iVar4 != 0) {
                    iVar15 = iVar4;
                  }
                  bVar13 = 1;
                  if (iVar4 != 0 && reduceTime) break;
                }
              }
              else {
LAB_00111649:
                iVar15 = iVar5;
                iVar4 = iVar15;
                if (reduceTime) break;
              }
            }
            exr_decoding_destroy(f,&local_228);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            goto LAB_00111c1a;
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&imgdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        goto LAB_0011151a;
      }
    }
    bVar2 = false;
  }
  else {
LAB_0011151a:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        if (store == EXR_STORAGE_SCANLINE || store == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED || store == EXR_STORAGE_DEEP_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}